

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

bool __thiscall zmq::stream_engine_base_t::restart_input(stream_engine_base_t *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  uchar *puVar4;
  stream_engine_base_t *in_RDI;
  size_t processed;
  int rc;
  session_base_t *in_stack_ffffffffffffffa0;
  session_base_t *psVar5;
  code *local_40;
  ulong local_20;
  int local_14;
  
  if (((in_RDI->_input_stopped ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_input_stopped",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a1);
    fflush(_stderr);
    zmq_abort((char *)0x30838d);
  }
  if (in_RDI->_session == (session_base_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_session != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a2);
    fflush(_stderr);
    zmq_abort((char *)0x3083f0);
  }
  if (in_RDI->_decoder == (i_decoder *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_decoder != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1a3);
    fflush(_stderr);
    zmq_abort((char *)0x308453);
  }
  local_40 = (code *)in_RDI->_process_msg;
  puVar4 = (in_RDI->_options).routing_id + *(long *)&in_RDI->field_0x560 + -0x29;
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *(long *)puVar4 + -1);
  }
  iVar2 = (*in_RDI->_decoder->_vptr_i_decoder[5])();
  local_14 = (*local_40)(puVar4,iVar2);
  if (local_14 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      session_base_t::flush(in_stack_ffffffffffffffa0);
      return true;
    }
    (*(in_RDI->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(in_RDI,0);
    return false;
  }
  while (in_RDI->_insize != 0) {
    local_20 = 0;
    local_14 = (*in_RDI->_decoder->_vptr_i_decoder[4])
                         (in_RDI->_decoder,in_RDI->_inpos,in_RDI->_insize,&local_20);
    if (in_RDI->_insize < local_20) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","processed <= _insize",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
              ,0x1b3);
      fflush(_stderr);
      zmq_abort((char *)0x3085c3);
    }
    in_RDI->_inpos = in_RDI->_inpos + local_20;
    in_RDI->_insize = in_RDI->_insize - local_20;
    if ((local_14 == 0) || (local_14 == -1)) break;
    psVar5 = (session_base_t *)in_RDI->_process_msg;
    puVar4 = (in_RDI->_options).routing_id + *(long *)&in_RDI->field_0x560 + -0x29;
    if (((ulong)psVar5 & 1) != 0) {
      psVar5 = *(session_base_t **)
                ((psVar5->super_own_t).options.routing_id + *(long *)puVar4 + -0x2a);
    }
    in_stack_ffffffffffffffa0 = psVar5;
    iVar2 = (*in_RDI->_decoder->_vptr_i_decoder[5])();
    local_14 = (*(code *)psVar5)(puVar4,iVar2);
    if (local_14 == -1) break;
  }
  if ((local_14 == -1) && (piVar3 = __errno_location(), *piVar3 == 0xb)) {
    session_base_t::flush(in_stack_ffffffffffffffa0);
  }
  else {
    if ((in_RDI->_io_error & 1U) != 0) {
      (*(in_RDI->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(in_RDI,1);
      return false;
    }
    if (local_14 == -1) {
      (*(in_RDI->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(in_RDI,0);
      return false;
    }
    in_RDI->_input_stopped = false;
    set_pollin((stream_engine_base_t *)0x308706);
    session_base_t::flush(in_stack_ffffffffffffffa0);
    bVar1 = in_event_internal(in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool zmq::stream_engine_base_t::restart_input ()
{
    zmq_assert (_input_stopped);
    zmq_assert (_session != NULL);
    zmq_assert (_decoder != NULL);

    int rc = (this->*_process_msg) (_decoder->msg ());
    if (rc == -1) {
        if (errno == EAGAIN)
            _session->flush ();
        else {
            error (protocol_error);
            return false;
        }
        return true;
    }

    while (_insize > 0) {
        size_t processed = 0;
        rc = _decoder->decode (_inpos, _insize, processed);
        zmq_assert (processed <= _insize);
        _inpos += processed;
        _insize -= processed;
        if (rc == 0 || rc == -1)
            break;
        rc = (this->*_process_msg) (_decoder->msg ());
        if (rc == -1)
            break;
    }

    if (rc == -1 && errno == EAGAIN)
        _session->flush ();
    else if (_io_error) {
        error (connection_error);
        return false;
    } else if (rc == -1) {
        error (protocol_error);
        return false;
    }

    else {
        _input_stopped = false;
        set_pollin ();
        _session->flush ();

        //  Speculative read.
        if (!in_event_internal ())
            return false;
    }

    return true;
}